

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O0

void __thiscall
ncnn::Mat::create(Mat *this,int _w,int _h,int _c,size_t _elemsize,Allocator *_allocator)

{
  size_t sVar1;
  void *pvVar2;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  Mat *in_RDI;
  size_t in_R8;
  Allocator *in_R9;
  size_t totalsize;
  Mat *in_stack_ffffffffffffffd0;
  
  if ((((in_RDI->dims != 3) || (in_RDI->w != in_ESI)) || (in_RDI->h != in_EDX)) ||
     (((in_RDI->c != in_ECX || (in_RDI->elemsize != in_R8)) ||
      ((in_RDI->packing != 1 || (in_RDI->allocator != in_R9)))))) {
    release(in_stack_ffffffffffffffd0);
    in_RDI->elemsize = in_R8;
    in_RDI->packing = 1;
    in_RDI->allocator = in_R9;
    in_RDI->dims = 3;
    in_RDI->w = in_ESI;
    in_RDI->h = in_EDX;
    in_RDI->c = in_ECX;
    sVar1 = ncnn::alignSize((long)(in_RDI->w * in_RDI->h) * in_RDI->elemsize,0x10);
    in_RDI->cstep = sVar1 / in_RDI->elemsize;
    sVar1 = total(in_RDI);
    if (sVar1 != 0) {
      sVar1 = total(in_RDI);
      sVar1 = ncnn::alignSize(sVar1 * in_RDI->elemsize,4);
      if (in_RDI->allocator == (Allocator *)0x0) {
        pvVar2 = ncnn::fastMalloc(sVar1);
        in_RDI->data = pvVar2;
      }
      else {
        pvVar2 = (void *)(**(code **)(*(long *)in_RDI->allocator + 0x10))
                                   (in_RDI->allocator,sVar1 + 4);
        in_RDI->data = pvVar2;
      }
      in_RDI->refcount = (int *)((long)in_RDI->data + sVar1);
      *in_RDI->refcount = 1;
    }
  }
  return;
}

Assistant:

inline void Mat::create(int _w, int _h, int _c, size_t _elemsize, Allocator* _allocator)
{
    if (dims == 3 && w == _w && h == _h && c == _c && elemsize == _elemsize && packing == 1 && allocator == _allocator)
        return;

    release();

    elemsize = _elemsize;
    packing = 1;
    allocator = _allocator;

    dims = 3;
    w = _w;
    h = _h;
    c = _c;

    cstep = alignSize(w * h * elemsize, 16) / elemsize;

    if (total() > 0)
    {
        size_t totalsize = alignSize(total() * elemsize, 4);
        if (allocator)
            data = allocator->fastMalloc(totalsize + (int)sizeof(*refcount));
        else
            data = fastMalloc(totalsize + (int)sizeof(*refcount));
        refcount = (int*)(((unsigned char*)data) + totalsize);
        *refcount = 1;
    }
}